

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool __thiscall icu_63::RegexMatcher::matches(RegexMatcher *this,UErrorCode *status)

{
  UText *pUVar1;
  UBool UVar2;
  int64_t iVar3;
  
  if (U_ZERO_ERROR < *status) {
    return '\0';
  }
  if (U_ZERO_ERROR < this->fDeferredStatus) {
    *status = this->fDeferredStatus;
    return '\0';
  }
  if (this->fInputUniStrMaybeMutable != '\0') {
    UVar2 = compat_SyncMutableUTextContents(this->fInputText);
    if (UVar2 == '\0') goto LAB_00165cd6;
    iVar3 = utext_nativeLength_63(this->fInputText);
    this->fInputLength = iVar3;
    this->fRegionStart = 0;
    this->fRegionLimit = iVar3;
    this->fActiveStart = 0;
    this->fActiveLimit = iVar3;
    this->fAnchorStart = 0;
    this->fAnchorLimit = iVar3;
    this->fLookStart = 0;
    this->fLookLimit = iVar3;
  }
  this->fMatchStart = 0;
  this->fMatchEnd = 0;
  this->fLastMatchEnd = -1;
  this->fAppendPosition = 0;
  this->fMatch = '\0';
  this->fHitEnd = '\0';
  this->fRequireEnd = '\0';
  this->fTime = 0;
  this->fTickCounter = 10000;
LAB_00165cd6:
  pUVar1 = this->fInputText;
  if (((pUVar1->chunkNativeStart == 0) && (this->fInputLength == pUVar1->chunkNativeLimit)) &&
     (this->fInputLength == (long)pUVar1->nativeIndexingLimit)) {
    MatchChunkAt(this,(int32_t)this->fActiveStart,'\x01',status);
  }
  else {
    MatchAt(this,this->fActiveStart,'\x01',status);
  }
  return this->fMatch;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }